

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O2

void __thiscall QThreadPool::setMaxThreadCount(QThreadPool *this,int maxThreadCount)

{
  QThreadPoolPrivate *this_00;
  long in_FS_OFFSET;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QThreadPoolPrivate *)(this->super_QObject).d_ptr.d;
  local_28._0_8_ = &this_00->mutex;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBasicMutex::lock((QBasicMutex *)local_28._0_8_);
  local_28[8] = true;
  if (this_00->requestedMaxThreadCount != maxThreadCount) {
    this_00->requestedMaxThreadCount = maxThreadCount;
    QThreadPoolPrivate::tryToStartMoreThreads(this_00);
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QThreadPool::setMaxThreadCount(int maxThreadCount)
{
    Q_D(QThreadPool);
    QMutexLocker locker(&d->mutex);

    if (maxThreadCount == d->requestedMaxThreadCount)
        return;

    d->requestedMaxThreadCount = maxThreadCount;
    d->tryToStartMoreThreads();
}